

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O3

SVInt __thiscall slang::SVInt::shl(SVInt *this,bitwidth_t amount)

{
  bool bVar1;
  uint bits;
  uint64_t *src;
  uint numWords;
  uint64_t *puVar2;
  byte bVar3;
  bool bVar4;
  uint in_EDX;
  undefined8 extraout_RDX;
  uint64_t value;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar5;
  undefined4 in_register_00000034;
  SVIntStorage *other;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  SVInt SVar9;
  
  other = (SVIntStorage *)CONCAT44(in_register_00000034,amount);
  if (in_EDX == 0) {
    SVInt(this,other);
    uVar5 = extraout_RDX;
  }
  else {
    bits = other->bitWidth;
    if (in_EDX < bits) {
      bVar4 = other->unknownFlag;
      bVar3 = (byte)in_EDX;
      if (0x40 < bits || (bVar4 & 1U) != 0) {
        bVar1 = other->signFlag;
        numWords = bits + 0x3f >> 6;
        iVar8 = numWords << (bVar4 & 0x1fU);
        puVar2 = (uint64_t *)operator_new__((ulong)(uint)(iVar8 * 8));
        (this->super_SVIntStorage).field_0.pVal = puVar2;
        (this->super_SVIntStorage).bitWidth = bits;
        (this->super_SVIntStorage).signFlag = bVar1;
        (this->super_SVIntStorage).unknownFlag = bVar4;
        if (in_EDX < 0x40 && (bVar4 & 1U) == 0) {
          if (0x3f < bits + 0x3f) {
            puVar2 = (other->field_0).pVal;
            uVar6 = 0;
            uVar7 = 0;
            do {
              (this->super_SVIntStorage).field_0.pVal[uVar6] =
                   puVar2[uVar6] << (bVar3 & 0x3f) | uVar7;
              puVar2 = (other->field_0).pVal;
              uVar7 = puVar2[uVar6] >> (0x40 - bVar3 & 0x3f);
              uVar6 = uVar6 + 1;
            } while (iVar8 + (uint)(iVar8 == 0) != uVar6);
          }
        }
        else {
          src = (other->field_0).pVal;
          shlFar(puVar2,src,in_EDX & 0x3f,in_EDX >> 6,0,numWords);
          if ((bVar4 & 1U) != 0) {
            shlFar(puVar2,src,in_EDX & 0x3f,in_EDX >> 6,numWords,numWords);
          }
        }
        clearUnusedBits(this);
        checkUnknown(this);
        uVar5 = extraout_RDX_01;
        goto LAB_002b98b0;
      }
      value = (other->field_0).val << (bVar3 & 0x3f);
      bVar4 = other->signFlag;
    }
    else {
      bVar4 = other->signFlag;
      value = 0;
    }
    SVInt(this,bits,value,bVar4);
    uVar5 = extraout_RDX_00;
  }
LAB_002b98b0:
  SVar9.super_SVIntStorage.bitWidth = (int)uVar5;
  SVar9.super_SVIntStorage.signFlag = (bool)(char)((ulong)uVar5 >> 0x20);
  SVar9.super_SVIntStorage.unknownFlag = (bool)(char)((ulong)uVar5 >> 0x28);
  SVar9.super_SVIntStorage._14_2_ = (short)((ulong)uVar5 >> 0x30);
  SVar9.super_SVIntStorage.field_0.pVal = (uint64_t *)this;
  return (SVInt)SVar9.super_SVIntStorage;
}

Assistant:

SVInt SVInt::shl(bitwidth_t amount) const {
    // handle trivial cases
    if (amount == 0)
        return *this;
    if (amount >= bitWidth) // if the shift amount is too large, we end up with zero anyway
        return SVInt(bitWidth, 0, signFlag);
    if (isSingleWord())
        return SVInt(bitWidth, val << amount, signFlag);

    // handle the small shift case
    SVInt result = allocUninitialized(bitWidth, signFlag, unknownFlag);
    if (amount < BITS_PER_WORD && !unknownFlag) {
        uint64_t carry = 0;
        for (uint32_t i = 0; i < getNumWords(); i++) {
            result.pVal[i] = pVal[i] << amount | carry;
            carry = pVal[i] >> (BITS_PER_WORD - amount);
        }
    }
    else {
        // otherwise do a full shift
        uint32_t numWords = getNumWords(bitWidth, false);
        uint32_t wordShift = amount % BITS_PER_WORD;
        uint32_t offset = amount / BITS_PER_WORD;

        // also handle shifting the unknown bits if necessary
        shlFar(result.pVal, pVal, wordShift, offset, 0, numWords);
        if (unknownFlag)
            shlFar(result.pVal, pVal, wordShift, offset, numWords, numWords);
    }

    result.clearUnusedBits();
    result.checkUnknown();
    return result;
}